

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<std::basic_string_view<char,std::char_traits<char>>&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  format_args args_00;
  string_view fmt_00;
  string_view_t msg;
  char *s;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RDI;
  undefined8 in_R8;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffb80;
  logger *in_stack_fffffffffffffb88;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffb90;
  basic_appender<char> *in_stack_fffffffffffffbb8;
  unsigned_long_long in_stack_fffffffffffffbc0;
  buffer<char> *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  size_t in_stack_fffffffffffffbd8;
  level_enum lvl_00;
  log_msg *this_01;
  size_t in_stack_fffffffffffffc00;
  string_view_t in_stack_fffffffffffffc08;
  source_loc in_stack_fffffffffffffc20;
  basic_string_view<char> local_368 [2];
  char *local_348;
  size_t sStack_340;
  log_msg *local_338;
  buffer<char> *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  basic_appender<char> local_290 [4];
  buffer<char> local_270 [9];
  undefined1 local_14a;
  byte local_149;
  undefined8 local_148;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  
  this_01 = (log_msg *)&stack0x00000008;
  local_148 = in_R8;
  local_130 = in_RDX;
  uStack_128 = in_RCX;
  local_149 = should_log(in_stack_fffffffffffffb88,
                         (level_enum)((ulong)in_stack_fffffffffffffb80 >> 0x20));
  local_14a = details::backtracer::enabled((backtracer *)0x6a7961);
  if (((local_149 & 1) != 0) || ((bool)local_14a)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffb80,(allocator<char> *)in_stack_fffffffffffffb78);
    ::fmt::v11::basic_appender<char>::basic_appender(local_290,local_270);
    local_2a8 = local_130;
    uStack_2a0 = uStack_128;
    local_120 = local_148;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffffb90,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88);
    local_2c8 = local_118;
    local_2c0 = local_110;
    local_100 = &local_2b8;
    local_108 = &local_2c8;
    local_2b8 = 0xd;
    fmt_00.data_._4_4_ = in_stack_fffffffffffffbd4;
    fmt_00.data_._0_4_ = in_stack_fffffffffffffbd0;
    fmt_00.size_ = in_stack_fffffffffffffbd8;
    args_00.field_1.values_ = in_stack_fffffffffffffbc8.values_;
    args_00.desc_ = in_stack_fffffffffffffbc0;
    local_2b0 = local_108;
    local_2d0 = (buffer<char> *)
                ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffbb8,fmt_00,args_00);
    lvl_00 = (level_enum)((ulong)local_110 >> 0x20);
    local_338 = *(log_msg **)&this_01->level;
    local_348 = (this_01->logger_name).data_;
    sStack_340 = (this_01->logger_name).size_;
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    this_00 = local_270;
    s = ::fmt::v11::detail::buffer<char>::data(this_00);
    sVar1 = ::fmt::v11::detail::buffer<char>::size(this_00);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_368,s,sVar1);
    msg.size_ = in_stack_fffffffffffffc00;
    msg.data_ = in_RDI;
    sVar1 = sStack_340;
    log_msg_00 = local_338;
    details::log_msg::log_msg
              (this_01,in_stack_fffffffffffffc20,in_stack_fffffffffffffc08,lvl_00,msg);
    log_it_(in_stack_fffffffffffffb90,log_msg_00,SUB81(sVar1 >> 0x38,0),SUB81(sVar1 >> 0x30,0));
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x6a7b95);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }